

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v5::internal::
arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>::
char_spec_handler::on_int(char_spec_handler *this)

{
  size_t in_RCX;
  void *in_RDX;
  long *in_RDI;
  wchar_t in_stack_0000001c;
  basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>
  *in_stack_00000020;
  
  if (*(long *)(*in_RDI + 0x10) == 0) {
    basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>::write
              ((basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>
                *)*in_RDI,(int)in_RDI[1],in_RDX,in_RCX);
  }
  else {
    basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>::
    write_int<wchar_t,fmt::v5::basic_format_specs<wchar_t>>
              (in_stack_00000020,in_stack_0000001c,(basic_format_specs<wchar_t> *)this);
  }
  return;
}

Assistant:

void on_int() {
      if (formatter.specs_)
        formatter.writer_.write_int(value, *formatter.specs_);
      else
        formatter.writer_.write(value);
    }